

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Driver.c
# Opt level: O2

Vec_Int_t * Llb_DriverCountRefs(Aig_Man_t *p)

{
  int *piVar1;
  int nCap;
  int iVar2;
  int *__s;
  Vec_Int_t *pVVar3;
  void *pvVar4;
  int iVar5;
  
  nCap = p->vObjs->nSize;
  pVVar3 = Vec_IntAlloc(nCap);
  pVVar3->nSize = nCap;
  __s = pVVar3->pArray;
  iVar5 = 0;
  memset(__s,0,(long)nCap << 2);
  while( true ) {
    if (p->nRegs <= iVar5) {
      return pVVar3;
    }
    pvVar4 = Vec_PtrEntry(p->vCos,p->nTruePos + iVar5);
    if (*(ulong *)((long)pvVar4 + 8) == 0) break;
    iVar2 = *(int *)((*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe) + 0x24);
    if (((long)iVar2 < 0) || (nCap <= iVar2)) break;
    piVar1 = __s + iVar2;
    *piVar1 = *piVar1 + 1;
    iVar5 = iVar5 + 1;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

// driver issue:arises when creating
// - driver ref-counter array
// - Ns2Glo maps
// - final partition
// - change-phase cube

// LI variable is used when
// - driver drives more than one LI
// - driver is a PI
// - driver is a constant

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Returns the array of times each flop driver is referenced.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Llb_DriverCountRefs( Aig_Man_t * p )
{
    Vec_Int_t * vCounts;
    Aig_Obj_t * pObj;
    int i;
    vCounts = Vec_IntStart( Aig_ManObjNumMax(p) );
    Saig_ManForEachLi( p, pObj, i )
        Vec_IntAddToEntry( vCounts, Aig_ObjFaninId0(pObj), 1 );
    return vCounts;
}